

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printJointPolicyPureVector.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  DecPOMDPDiscreteInterface *pDVar1;
  NullPlanner *this;
  JointPolicy *this_00;
  ostream *poVar2;
  ulonglong uVar3;
  undefined8 in_RSI;
  undefined4 in_EDI;
  bool bVar4;
  E *e;
  JointPolicyPureVector jp;
  NullPlanner *np;
  LIndex index;
  DecPOMDPDiscreteInterface *dpomdp;
  Arguments args;
  LIndex in_stack_fffffffffffffc88;
  ostream *in_stack_fffffffffffffc90;
  Interface_ProblemToPolicyDiscretePure *in_stack_fffffffffffffcb8;
  JointPolicy *pJVar5;
  JointPolicyPureVector *in_stack_fffffffffffffcc0;
  Arguments *in_stack_fffffffffffffcd0;
  Arguments local_248;
  undefined8 local_10;
  undefined4 local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffffcd0);
  argp_parse(ArgumentHandlers::theArgpStruc,local_8,local_10,0,0,&local_248);
  pDVar1 = (DecPOMDPDiscreteInterface *)
           ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_248);
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner
            (this,(long)local_248.horizon,pDVar1,(PlanningUnitMADPDiscreteParameters *)0x0);
  JointPolicyPureVector::JointPolicyPureVector(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  pJVar5 = (JointPolicy *)local_248.jpolIndex;
  this_00 = (JointPolicy *)PlanningUnitMADPDiscrete::GetNrJointPolicies();
  bVar4 = pJVar5 < this_00;
  if (bVar4) {
    JointPolicyPureVector::SetIndex
              ((JointPolicyPureVector *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    JointPolicy::Print(this_00);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: index ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_248.jpolIndex);
    poVar2 = std::operator<<(poVar2," is too high, there are only ");
    uVar3 = PlanningUnitMADPDiscrete::GetNrJointPolicies();
    in_stack_fffffffffffffc90 = (ostream *)std::ostream::operator<<(poVar2,uVar3);
    poVar2 = std::operator<<(in_stack_fffffffffffffc90," joint policies.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  JointPolicyPureVector::~JointPolicyPureVector((JointPolicyPureVector *)in_stack_fffffffffffffc90);
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x1041e2);
  if (bVar4) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
    try {

    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    DecPOMDPDiscreteInterface *dpomdp=GetDecPOMDPDiscreteInterfaceFromArgs(args);
    LIndex index=args.jpolIndex;
    NullPlanner *np=new NullPlanner(args.horizon,dpomdp);
    JointPolicyPureVector jp(np);

    if(index>=np->GetNrJointPolicies())
    {
        cout << "Error: index " << index << " is too high, there are only "
             << np->GetNrJointPolicies() << " joint policies." << endl;
        return(0);
    }
    jp.SetIndex(index);

    jp.Print();
    }
    catch(E& e){ e.Print(); }

    return(0);
}